

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this)

{
  ResultValueBase<Catch::clara::detail::ParseResultType> *in_RDI;
  
  (in_RDI->super_ResultBase)._vptr_ResultBase = (_func_int **)&PTR__BasicResult_003a3338;
  ::std::__cxx11::string::~string((string *)(in_RDI + 1));
  ResultValueBase<Catch::clara::detail::ParseResultType>::~ResultValueBase(in_RDI);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }